

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adplanner.cpp
# Opt level: O2

void __thiscall ADPlanner::Recomputegval(ADPlanner *this,ADState *state)

{
  bool bVar1;
  DiscreteSpaceInformation *pDVar2;
  int iVar3;
  undefined4 extraout_var;
  uint uVar5;
  int pind;
  long lVar6;
  vector<int,_std::allocator<int>_> searchpredsIDV;
  vector<int,_std::allocator<int>_> costV;
  long lVar4;
  
  searchpredsIDV.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  costV.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  searchpredsIDV.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  searchpredsIDV.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  costV.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  costV.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  pDVar2 = (this->super_SBPLPlanner).environment_;
  lVar6 = 0x28;
  if (this->bforwardsearch != false) {
    lVar6 = 0x58;
  }
  (**(code **)((long)pDVar2->_vptr_DiscreteSpaceInformation + lVar6))
            (pDVar2,**(undefined4 **)(state + 0x18));
  *(undefined4 *)(state + 0x24) = 1000000000;
  for (lVar6 = 0;
      lVar6 < (int)((ulong)((long)searchpredsIDV.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)searchpredsIDV.super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 2); lVar6 = lVar6 + 1)
  {
    if (*(((this->super_SBPLPlanner).environment_)->StateID2IndexMapping).
         super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.super__Vector_impl_data._M_start
         [searchpredsIDV.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[lVar6]] != -1) {
      iVar3 = (*(this->super_SBPLPlanner)._vptr_SBPLPlanner[0x19])
                        (this,(long)searchpredsIDV.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start[lVar6],
                         this->pSearchStateSpace_);
      lVar4 = CONCAT44(extraout_var,iVar3);
      if (*(unsigned_short *)(*(long *)(lVar4 + 0x38) + 0x2a) ==
          this->pSearchStateSpace_->callnumber) {
        iVar3 = costV.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start[lVar6];
        uVar5 = *(int *)(*(long *)(lVar4 + 0x38) + 0x20) + iVar3;
        if (uVar5 < *(uint *)(state + 0x24)) {
          bVar1 = this->bforwardsearch;
          *(uint *)(state + 0x24) = uVar5;
          if (bVar1 == true) {
            *(long *)(state + 0x30) = lVar4;
          }
          else {
            *(long *)(state + 0x38) = lVar4;
            *(int *)(state + 0x40) = iVar3;
          }
        }
      }
    }
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&costV.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&searchpredsIDV.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void ADPlanner::Recomputegval(ADState* state)
{
    vector<int> searchpredsIDV; //these are predecessors if search is done forward and successors otherwise
    vector<int> costV;
    CKey key;
    ADState *searchpredstate;

    if (bforwardsearch)
        environment_->GetPreds(state->MDPstate->StateID, &searchpredsIDV, &costV);
    else
        environment_->GetSuccs(state->MDPstate->StateID, &searchpredsIDV, &costV);

    //iterate through predecessors of s and pick the best
    state->g = INFINITECOST;
    for (int pind = 0; pind < (int)searchpredsIDV.size(); pind++) {
        //skip the states that do not exist - they can not be used to improve g-value anyway
        if (environment_->StateID2IndexMapping[searchpredsIDV[pind]][ADMDP_STATEID2IND] == -1) continue;

        CMDPSTATE* predMDPState = GetState(searchpredsIDV[pind], pSearchStateSpace_);
        int cost = costV[pind];
        searchpredstate = (ADState*)(predMDPState->PlannerSpecificData);

        //see if it can be used to improve
        if (searchpredstate->callnumberaccessed == pSearchStateSpace_->callnumber && state->g > searchpredstate->v
            + cost) {
            if (bforwardsearch) {
                state->g = searchpredstate->v + cost;
                state->bestpredstate = predMDPState;
            }
            else {
                state->g = searchpredstate->v + cost;
                state->bestnextstate = predMDPState;
                state->costtobestnextstate = cost;
            }
        }
    } //over preds
}